

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::TrackIntegrate
          (Recycler *this,char *blockAddress,size_t blockSize,size_t allocSize,size_t objectSize,
          TrackAllocData *trackAllocData)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *pcVar5;
  
  if (this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) {
    return;
  }
  if ((((this->nextAllocData).typeinfo != (type_info *)0x0) || ((this->nextAllocData).plusSize != 0)
      ) || ((this->nextAllocData).count != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x204b,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
  pcVar5 = blockAddress + blockSize;
  pcVar1 = blockAddress + allocSize;
  while (pcVar1 <= pcVar5) {
    TrackAllocCore(this,blockAddress,objectSize,trackAllocData,false);
    blockAddress = blockAddress + allocSize;
    pcVar1 = blockAddress + allocSize;
  }
  CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
  return;
}

Assistant:

void
Recycler::TrackIntegrate(__in_ecount(blockSize) char * blockAddress, size_t blockSize, size_t allocSize, size_t objectSize, const TrackAllocData& trackAllocData)
{
    if (this->trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty()); // should have been cleared
        trackerCriticalSection->Enter();

        char * address = blockAddress;
        char * blockEnd = blockAddress + blockSize;
        while (address + allocSize <= blockEnd)
        {
            TrackAllocCore(address, objectSize, trackAllocData);
            address += allocSize;
        }

        trackerCriticalSection->Leave();
    }
}